

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O2

lysc_pattern ** lysc_patterns_dup(ly_ctx *ctx,lysc_pattern **orig)

{
  undefined1 *puVar1;
  long *plVar2;
  lysc_pattern **pplVar3;
  lysc_pattern *plVar4;
  long lVar5;
  
  plVar4 = orig[-1];
  lVar5 = 1;
  plVar2 = (long *)calloc(1,(long)plVar4 * 8 + 8);
  if (plVar2 == (long *)0x0) {
    pplVar3 = (lysc_pattern **)0x0;
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysc_patterns_dup");
  }
  else {
    pplVar3 = (lysc_pattern **)(plVar2 + 1);
    for (; (lysc_pattern *)(lVar5 - 1U) < plVar4; lVar5 = lVar5 + 1) {
      plVar4 = orig[lVar5 + -1];
      puVar1 = &plVar4->field_0x38;
      *(int *)puVar1 = *(int *)puVar1 + 2;
      plVar2[lVar5] = (long)plVar4;
      *plVar2 = lVar5;
      plVar4 = orig[-1];
    }
  }
  return pplVar3;
}

Assistant:

static struct lysc_pattern **
lysc_patterns_dup(struct ly_ctx *ctx, struct lysc_pattern **orig)
{
    struct lysc_pattern **dup = NULL;
    LY_ARRAY_COUNT_TYPE u;

    assert(orig);

    LY_ARRAY_CREATE_RET(ctx, dup, LY_ARRAY_COUNT(orig), NULL);
    LY_ARRAY_FOR(orig, u) {
        dup[u] = lysc_pattern_dup(orig[u]);
        LY_ARRAY_INCREMENT(dup);
    }
    return dup;
}